

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O1

char * phone_num_to_string(char *string_buf,size_t string_buf_len,uint8_t *num_buf,
                          size_t num_buf_len)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  bool bVar6;
  
  pcVar1 = string_buf;
  if (num_buf_len != 0) {
    lVar2 = 0;
    uVar3 = 0;
    pbVar5 = (byte *)string_buf;
    do {
      bVar6 = true;
      uVar4 = uVar3;
      string_buf = (char *)pbVar5;
      if (num_buf[lVar2] >> 4 != 0xe) {
        *pbVar5 = num_buf[lVar2] >> 4 | 0x30;
        uVar4 = uVar3 + 1;
        string_buf = (char *)(pbVar5 + 1);
        if ((uVar4 < string_buf_len - 1) && ((num_buf[lVar2] & 0xf) != 0xe)) {
          pbVar5[1] = num_buf[lVar2] & 0xf | 0x30;
          string_buf = (char *)(pbVar5 + 2);
          uVar4 = uVar3 + 2;
          bVar6 = string_buf_len - 1 <= uVar4;
        }
      }
    } while ((!bVar6) &&
            (bVar6 = num_buf_len - 1 != lVar2, lVar2 = lVar2 + 1, uVar3 = uVar4,
            pbVar5 = (byte *)string_buf, bVar6));
  }
  *string_buf = 0;
  return pcVar1;
}

Assistant:

extern char* phone_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        if (pn_digit == 0xe) break;
        *pstr++ = (pn_digit) + '0';
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;

        if (pn_digit == 0xe) break;
        *pstr++ = (pn_digit) + '0';
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}